

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O1

HTS_Boolean HTS_get_token_from_fp(HTS_File *fp,char *buff)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  if (fp == (HTS_File *)0x0) {
    return '\0';
  }
  iVar2 = HTS_feof(fp);
  if (iVar2 == 0) {
    uVar3 = HTS_fgetc(fp);
    do {
      if ((0x20 < (byte)uVar3) || ((0x100000600U >> ((ulong)(uVar3 & 0xff) & 0x3f) & 1) == 0)) {
        lVar1 = 0;
        goto LAB_00150069;
      }
      iVar2 = HTS_feof(fp);
    } while ((iVar2 == 0) && (uVar3 = HTS_fgetc(fp), (char)uVar3 != -1));
  }
  return '\0';
  while( true ) {
    uVar3 = HTS_fgetc(fp);
    lVar1 = lVar4 + 1;
    if ((char)uVar3 == -1) break;
LAB_00150069:
    lVar4 = lVar1;
    if (((byte)uVar3 < 0x21) && ((0x100000600U >> ((ulong)(uVar3 & 0xff) & 0x3f) & 1) != 0))
    goto LAB_0015009d;
    buff[lVar4] = (byte)uVar3;
    iVar2 = HTS_feof(fp);
    if (iVar2 != 0) break;
  }
  lVar4 = lVar4 + 1;
LAB_0015009d:
  buff[lVar4] = '\0';
  return '\x01';
}

Assistant:

HTS_Boolean HTS_get_token_from_fp(HTS_File * fp, char *buff)
{
   char c;
   size_t i;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);
   while (c == ' ' || c == '\n' || c == '\t') {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      if (c == EOF)
         return FALSE;
   }

   for (i = 0; c != ' ' && c != '\n' && c != '\t';) {
      buff[i++] = c;
      if (HTS_feof(fp))
         break;
      c = HTS_fgetc(fp);
      if (c == EOF)
         break;
   }

   buff[i] = '\0';
   return TRUE;
}